

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O0

int X509_PUBKEY_set(X509_PUBKEY **x,EVP_PKEY *pkey)

{
  int iVar1;
  uchar *local_70;
  uint8_t *p;
  CBB cbb;
  size_t spki_len;
  uint8_t *spki;
  X509_PUBKEY *pk;
  EVP_PKEY *pkey_local;
  X509_PUBKEY **x_local;
  
  spki = (uint8_t *)0x0;
  spki_len = 0;
  if (x == (X509_PUBKEY **)0x0) {
    return 0;
  }
  pk = (X509_PUBKEY *)pkey;
  pkey_local = (EVP_PKEY *)x;
  iVar1 = CBB_init((CBB *)&p,0);
  if ((((iVar1 == 0) || (iVar1 = EVP_marshal_public_key((CBB *)&p,(EVP_PKEY *)pk), iVar1 == 0)) ||
      (iVar1 = CBB_finish((CBB *)&p,(uint8_t **)&spki_len,(size_t *)((long)&cbb.u + 0x18)),
      iVar1 == 0)) || (0x7fffffffffffffff < (ulong)cbb.u._24_8_)) {
    CBB_cleanup((CBB *)&p);
    ERR_put_error(0xb,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                  ,0x5e);
  }
  else {
    local_70 = (uchar *)spki_len;
    spki = (uint8_t *)d2i_X509_PUBKEY((X509_PUBKEY **)0x0,&local_70,cbb.u._24_8_);
    if (((X509_PUBKEY *)spki != (X509_PUBKEY *)0x0) &&
       (local_70 == (uchar *)(spki_len + cbb.u._24_8_))) {
      OPENSSL_free((void *)spki_len);
      X509_PUBKEY_free(*(X509_PUBKEY **)pkey_local);
      *(uint8_t **)pkey_local = spki;
      return 1;
    }
    ERR_put_error(0xb,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                  ,0x65);
  }
  X509_PUBKEY_free((X509_PUBKEY *)spki);
  OPENSSL_free((void *)spki_len);
  return 0;
}

Assistant:

int X509_PUBKEY_set(X509_PUBKEY **x, EVP_PKEY *pkey) {
  X509_PUBKEY *pk = NULL;
  uint8_t *spki = NULL;
  size_t spki_len;

  if (x == NULL) {
    return 0;
  }

  CBB cbb;
  const uint8_t *p;
  if (!CBB_init(&cbb, 0) ||  //
      !EVP_marshal_public_key(&cbb, pkey) ||
      !CBB_finish(&cbb, &spki, &spki_len) ||  //
      spki_len > LONG_MAX) {
    CBB_cleanup(&cbb);
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_ENCODE_ERROR);
    goto error;
  }

  p = spki;
  pk = d2i_X509_PUBKEY(NULL, &p, (long)spki_len);
  if (pk == NULL || p != spki + spki_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_DECODE_ERROR);
    goto error;
  }

  OPENSSL_free(spki);
  X509_PUBKEY_free(*x);
  *x = pk;

  return 1;
error:
  X509_PUBKEY_free(pk);
  OPENSSL_free(spki);
  return 0;
}